

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitCloud.c
# Opt level: O1

uint * Kit_TruthCompose(CloudManager *dd,uint *pTruth,int nVars,uint **pInputs,int nVarsAll,
                       Vec_Ptr_t *vStore,Vec_Int_t *vNodes)

{
  uint uVar1;
  void **ppvVar2;
  int *piVar3;
  void *pvVar4;
  void *pvVar5;
  uint *puVar6;
  uint uVar7;
  int iVar8;
  CloudNode *pFunc;
  long lVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint *__s;
  ulong uVar13;
  bool bVar14;
  
  Cloud_Restart(dd);
  pFunc = Kit_TruthToCloud_rec(dd,pTruth,nVars,nVars);
  iVar8 = Kit_CreateCloud(dd,pFunc,vNodes);
  if (iVar8 == 0) {
    puts("Kit_TruthCompose(): Internal failure!!!");
  }
  if (vStore->nSize < vNodes->nSize) {
    __assert_fail("Vec_IntSize(vNodes) <= Vec_PtrSize(vStore)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitCloud.c"
                  ,0x11a,
                  "unsigned int *Kit_TruthCompose(CloudManager *, unsigned int *, int, unsigned int **, int, Vec_Ptr_t *, Vec_Int_t *)"
                 );
  }
  if (vStore->nSize < 1) {
LAB_005c5f43:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  ppvVar2 = vStore->pArray;
  __s = (uint *)*ppvVar2;
  uVar7 = 1 << ((char)nVarsAll - 5U & 0x1f);
  if (nVarsAll < 6) {
    uVar7 = 1;
  }
  uVar13 = (ulong)uVar7;
  if (0 < (int)uVar7) {
    memset(__s,0xff,uVar13 * 4);
  }
  bVar14 = true;
  if (1 < vNodes->nSize) {
    piVar3 = vNodes->pArray;
    lVar9 = 1;
    do {
      uVar1 = piVar3[lVar9];
      uVar10 = uVar1 >> 0x11 & 0xfff;
      iVar8 = vStore->nSize;
      if (((iVar8 <= (int)uVar10) || (uVar11 = uVar1 >> 5 & 0xfff, iVar8 <= (int)uVar11)) ||
         (iVar8 <= lVar9)) goto LAB_005c5f43;
      pvVar4 = ppvVar2[uVar10];
      pvVar5 = ppvVar2[uVar11];
      __s = (uint *)ppvVar2[lVar9];
      puVar6 = pInputs[(int)((~uVar1 | 0xffffffe0) + nVars)];
      if ((uVar1 >> 0x1d & 1) == 0) {
        lVar12 = uVar13 + 1;
        if (0 < (int)uVar7) {
          do {
            uVar10 = *(uint *)((long)pvVar4 + lVar12 * 4 + -8);
            __s[lVar12 + -2] =
                 (*(uint *)((long)pvVar5 + lVar12 * 4 + -8) ^ uVar10) & puVar6[lVar12 + -2] ^ uVar10
            ;
            lVar12 = lVar12 + -1;
          } while (1 < lVar12);
        }
      }
      else {
        lVar12 = uVar13 + 1;
        if (0 < (int)uVar7) {
          do {
            uVar10 = puVar6[lVar12 + -2];
            __s[lVar12 + -2] =
                 uVar10 & *(uint *)((long)pvVar5 + lVar12 * 4 + -8) |
                 ~(*(uint *)((long)pvVar4 + lVar12 * 4 + -8) | uVar10);
            lVar12 = lVar12 + -1;
          } while (1 < lVar12);
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < vNodes->nSize);
    bVar14 = (uVar1 >> 0x1e & 1) == 0;
  }
  if ((0 < (int)uVar7) && (!bVar14)) {
    lVar9 = uVar13 + 1;
    do {
      __s[lVar9 + -2] = ~__s[lVar9 + -2];
      lVar9 = lVar9 + -1;
    } while (1 < lVar9);
  }
  return __s;
}

Assistant:

unsigned * Kit_TruthCompose( CloudManager * dd, unsigned * pTruth, int nVars, 
    unsigned ** pInputs, int nVarsAll, Vec_Ptr_t * vStore, Vec_Int_t * vNodes )
{
    CloudNode * pFunc;
    unsigned * pThis, * pFan0, * pFan1;
    Kit_Mux_t Mux;
    int i, Entry, RetValue;
    // derive BDD from truth table
    Cloud_Restart( dd );
    pFunc = Kit_TruthToCloud( dd, pTruth, nVars );
    // convert it into nodes
    RetValue = Kit_CreateCloud( dd, pFunc, vNodes );
    if ( RetValue == 0 )
        printf( "Kit_TruthCompose(): Internal failure!!!\n" );
    // verify the result
//    pFan0 = Kit_CloudToTruth( vNodes, nVars, vStore, 0 );
//    if ( !Kit_TruthIsEqual( pTruth, pFan0, nVars ) )
//        printf( "Failed!\n" );
    // compute truth table from the BDD
    assert( Vec_IntSize(vNodes) <= Vec_PtrSize(vStore) );
    pThis = (unsigned *)Vec_PtrEntry( vStore, 0 );
    Kit_TruthFill( pThis, nVarsAll );
    Vec_IntForEachEntryStart( vNodes, Entry, i, 1 )
    {
        Mux = Kit_Int2Mux(Entry);
        pFan0 = (unsigned *)Vec_PtrEntry( vStore, Mux.e );
        pFan1 = (unsigned *)Vec_PtrEntry( vStore, Mux.t );
        pThis = (unsigned *)Vec_PtrEntry( vStore, i );
        Kit_TruthMuxPhase( pThis, pFan0, pFan1, pInputs[nVars-1-Mux.v], nVarsAll, Mux.c );
    }
    // complement the result
    if ( Mux.i )
        Kit_TruthNot( pThis, pThis, nVarsAll );
    return pThis;
}